

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  long *plVar1;
  size_t sVar2;
  size_t sVar3;
  IStreamingReporter *pIVar4;
  ulong uVar5;
  size_t sVar6;
  Totals *_totals;
  undefined8 _testInfo;
  int iVar7;
  SectionTracker *pSVar8;
  undefined4 extraout_var;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  undefined1 local_1f0 [40];
  _Alloc_hider _Stack_1c8;
  TrackerContext *local_c0;
  size_t local_b8;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  Totals *local_98;
  size_t local_90;
  size_t local_88;
  TestCase **local_80;
  undefined1 local_78 [8];
  string redirectedCout;
  string redirectedCerr;
  
  local_a0 = (this->m_totals).assertions.passed;
  local_b0 = (this->m_totals).assertions.failed;
  local_a8 = (this->m_totals).assertions.failedButOk;
  local_b8 = (this->m_totals).testCases.passed;
  sVar2 = (this->m_totals).testCases.failed;
  sVar3 = (this->m_totals).testCases.failedButOk;
  local_78 = (undefined1  [8])&redirectedCout._M_string_length;
  redirectedCout._M_dataplus._M_p = (pointer)0x0;
  redirectedCout._M_string_length._0_1_ = 0;
  redirectedCout.field_2._8_8_ = &redirectedCerr._M_string_length;
  redirectedCerr._M_dataplus._M_p = (pointer)0x0;
  redirectedCerr._M_string_length._0_1_ = 0;
  pIVar4 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar4->_vptr_IStreamingReporter[7])(pIVar4,testCase);
  this->m_activeTestCase = testCase;
  local_c0 = &this->m_trackerContext;
  local_98 = __return_storage_ptr__;
  local_90 = sVar3;
  local_88 = sVar2;
  pSVar8 = (SectionTracker *)TestCaseTracking::TrackerContext::startRun(local_c0);
  iVar7 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[0x13])();
  TestCaseTracking::SectionTracker::addInitialFilters
            (pSVar8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(extraout_var,iVar7));
  local_80 = &this->m_activeTestCase;
  redirectedCerr.field_2._8_8_ = testCase;
  do {
    (this->m_trackerContext).m_currentTracker =
         (this->m_trackerContext).m_rootTracker.
         super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->m_trackerContext).m_runState = Executing;
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f0,*(long *)redirectedCerr.field_2._8_8_,
               *(long *)(redirectedCerr.field_2._8_8_ + 8) + *(long *)redirectedCerr.field_2._8_8_);
    local_1f0._32_8_ = (testCase->super_TestCaseInfo).lineInfo.file;
    _Stack_1c8._M_p = (pointer)(testCase->super_TestCaseInfo).lineInfo.line;
    pSVar8 = TestCaseTracking::SectionTracker::acquire(local_c0,(NameAndLocation *)local_1f0);
    this->m_testCaseTracker = (ITracker *)pSVar8;
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    runCurrentTest(this,(string *)local_78,(string *)((long)&redirectedCout.field_2 + 8));
    iVar7 = (*this->m_testCaseTracker->_vptr_ITracker[3])();
    if ((char)iVar7 != '\0') break;
    uVar5 = (this->m_totals).assertions.failed;
    iVar7 = (*(((this->m_config).
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[9])();
  } while (uVar5 < (ulong)(long)iVar7);
  _testInfo = redirectedCerr.field_2._8_8_;
  _totals = local_98;
  local_98->error = 0;
  uVar5 = (this->m_totals).assertions.failed;
  sVar9 = (this->m_totals).assertions.failedButOk - local_a8;
  sVar10 = uVar5 - local_b0;
  (local_98->assertions).passed = (this->m_totals).assertions.passed - local_a0;
  (local_98->assertions).failed = sVar10;
  (local_98->assertions).failedButOk = sVar9;
  sVar2 = (this->m_totals).testCases.passed;
  sVar3 = (this->m_totals).testCases.failed;
  sVar6 = (this->m_totals).testCases.failedButOk;
  uVar12 = 0x28;
  if (sVar10 == 0) {
    uVar12 = (ulong)(sVar9 != 0) << 4 | 0x20;
  }
  (local_98->testCases).passed = sVar2 - local_b8;
  (local_98->testCases).failed = sVar3 - local_88;
  (local_98->testCases).failedButOk = sVar6 - local_90;
  plVar1 = (long *)((long)&local_98->error + uVar12);
  *plVar1 = *plVar1 + 1;
  sVar9 = (local_98->testCases).passed;
  sVar11 = (local_98->testCases).failed;
  if ((sVar9 != 0 & *(byte *)(redirectedCerr.field_2._8_8_ + 0xa0) >> 2) == 1) {
    (local_98->assertions).failed = sVar10 + 1;
    sVar9 = sVar9 - 1;
    (local_98->testCases).passed = sVar9;
    sVar11 = sVar11 + 1;
    (local_98->testCases).failed = sVar11;
  }
  (this->m_totals).testCases.passed = sVar2 + sVar9;
  (this->m_totals).testCases.failed = sVar3 + sVar11;
  (this->m_totals).testCases.failedButOk = sVar6 + (local_98->testCases).failedButOk;
  pIVar4 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  iVar7 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[9])();
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)local_1f0,(TestCaseInfo *)_testInfo,_totals,(string *)local_78,
             (string *)((long)&redirectedCout.field_2 + 8),(ulong)(long)iVar7 <= uVar5);
  (*pIVar4->_vptr_IStreamingReporter[0xc])(pIVar4,local_1f0);
  TestCaseStats::~TestCaseStats((TestCaseStats *)local_1f0);
  *local_80 = (TestCase *)0x0;
  local_80[1] = (TestCase *)0x0;
  if ((size_type *)redirectedCout.field_2._8_8_ != &redirectedCerr._M_string_length) {
    operator_delete((void *)redirectedCout.field_2._8_8_,
                    CONCAT71(redirectedCerr._M_string_length._1_7_,
                             (undefined1)redirectedCerr._M_string_length) + 1);
  }
  if (local_78 != (undefined1  [8])&redirectedCout._M_string_length) {
    operator_delete((void *)local_78,
                    CONCAT71(redirectedCout._M_string_length._1_7_,
                             (undefined1)redirectedCout._M_string_length) + 1);
  }
  return _totals;
}

Assistant:

Totals RunContext::runTest(TestCase const& testCase) {
        Totals prevTotals = m_totals;

        std::string redirectedCout;
        std::string redirectedCerr;

        auto const& testInfo = testCase.getTestCaseInfo();

        m_reporter->testCaseStarting(testInfo);

        m_activeTestCase = &testCase;

        ITracker& rootTracker = m_trackerContext.startRun();
        assert(rootTracker.isSectionTracker());
        static_cast<SectionTracker&>(rootTracker).addInitialFilters(m_config->getSectionsToRun());
        do {
            m_trackerContext.startCycle();
            m_testCaseTracker = &SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocation(testInfo.name, testInfo.lineInfo));
            runCurrentTest(redirectedCout, redirectedCerr);
        } while (!m_testCaseTracker->isSuccessfullyCompleted() && !aborting());

        Totals deltaTotals = m_totals.delta(prevTotals);
        if (testInfo.expectedToFail() && deltaTotals.testCases.passed > 0) {
            deltaTotals.assertions.failed++;
            deltaTotals.testCases.passed--;
            deltaTotals.testCases.failed++;
        }
        m_totals.testCases += deltaTotals.testCases;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
            deltaTotals,
            redirectedCout,
            redirectedCerr,
            aborting()));

        m_activeTestCase = nullptr;
        m_testCaseTracker = nullptr;

        return deltaTotals;
    }